

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int DLevelScript::DoSpawn(int type,DVector3 *pos,int tid,DAngle *angle,bool force)

{
  bool bVar1;
  uint uVar2;
  char *name;
  PClassActor *pPVar3;
  AActor *pAVar4;
  bool local_62;
  TFlags<ActorFlag2,_unsigned_int> local_54;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag2,_unsigned_int> local_4c;
  TFlags<ActorFlag3,_unsigned_int> local_48;
  ActorFlags2 oldFlags2;
  int spawncount;
  AActor *actor;
  PClassActor *info;
  bool force_local;
  DAngle *angle_local;
  int tid_local;
  DVector3 *pos_local;
  int type_local;
  
  name = FBehavior::StaticLookupString(type);
  pPVar3 = PClass::FindActor(name);
  oldFlags2.Value = 0;
  if (pPVar3 != (PClassActor *)0x0) {
    pPVar3 = PClassActor::GetReplacement(pPVar3,true);
    pAVar4 = GetDefaultByType(&pPVar3->super_PClass);
    TFlags<ActorFlag3,_unsigned_int>::operator&
              (&local_48,
               (int)pAVar4 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
    local_62 = false;
    if (uVar2 != 0) {
      uVar2 = FIntCVar::operator_cast_to_int(&dmflags);
      local_62 = (uVar2 & 0x1000) != 0 || (::level.flags2 & 0x8000) != 0;
    }
    if (local_62) {
      return 0;
    }
    pAVar4 = Spawn(pPVar3,pos,ALLOW_REPLACE);
    if (pAVar4 != (AActor *)0x0) {
      TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_4c,&pAVar4->flags2);
      TFlags<ActorFlag2,_unsigned_int>::operator|=(&pAVar4->flags2,MF2_PASSMOBJ);
      if ((force) || (bVar1 = P_TestMobjLocation(pAVar4), bVar1)) {
        TAngle<double>::operator=(&(pAVar4->Angles).Yaw,angle);
        pAVar4->tid = tid;
        AActor::AddToHash(pAVar4);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_50,
                   (int)pAVar4 +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_50);
        if (uVar2 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator|=(&pAVar4->flags,MF_DROPPED);
        }
        TFlags<ActorFlag2,_unsigned_int>::TFlags(&local_54,&local_4c);
        TFlags<ActorFlag2,_unsigned_int>::operator=(&pAVar4->flags2,&local_54);
        oldFlags2.Value = oldFlags2.Value + 1;
      }
      else {
        AActor::ClearCounters(pAVar4);
        (*(pAVar4->super_DThinker).super_DObject._vptr_DObject[4])();
      }
    }
  }
  return oldFlags2.Value;
}

Assistant:

int DLevelScript::DoSpawn (int type, const DVector3 &pos, int tid, DAngle angle, bool force)
{
	PClassActor *info = PClass::FindActor(FBehavior::StaticLookupString (type));
	AActor *actor = NULL;
	int spawncount = 0;

	if (info != NULL)
	{
		info = info->GetReplacement ();

		if ((GetDefaultByType (info)->flags3 & MF3_ISMONSTER) &&
			((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		{
			return 0;
		}

		actor = Spawn (info, pos, ALLOW_REPLACE);
		if (actor != NULL)
		{
			ActorFlags2 oldFlags2 = actor->flags2;
			actor->flags2 |= MF2_PASSMOBJ;
			if (force || P_TestMobjLocation (actor))
			{
				actor->Angles.Yaw = angle;
				actor->tid = tid;
				actor->AddToHash ();
				if (actor->flags & MF_SPECIAL)
					actor->flags |= MF_DROPPED;  // Don't respawn
				actor->flags2 = oldFlags2;
				spawncount++;
			}
			else
			{
				// If this is a monster, subtract it from the total monster
				// count, because it already added to it during spawning.
				actor->ClearCounters();
				actor->Destroy ();
				actor = NULL;
			}
		}
	}
	return spawncount;
}